

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::addTimer(EventLoop *this,int id,long timeout,Functor *cb)

{
  TimerHeap *this_00;
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this_00 = (this->timer_).super___shared_ptr<TimerHeap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  TimerHeap::addTimer(this_00,id,timeout,(timeoutCallBack *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void EventLoop::addTimer(int id, long timeout, Functor cb) {
//    queueInLoop(std::bind(&TimerHeap::addTimer, timer_, connfd, timeout, std::move(cb)));
    timer_->addTimer(id, timeout, std::move(cb));
}